

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O0

void __thiscall
rate_adaptive_code_from_colptr_rowIdx_encode_no_ra_Test::
~rate_adaptive_code_from_colptr_rowIdx_encode_no_ra_Test
          (rate_adaptive_code_from_colptr_rowIdx_encode_no_ra_Test *this)

{
  rate_adaptive_code_from_colptr_rowIdx_encode_no_ra_Test *this_local;
  
  ~rate_adaptive_code_from_colptr_rowIdx_encode_no_ra_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(rate_adaptive_code_from_colptr_rowIdx, encode_no_ra) {
    auto H = get_code_big_nora();
    std::vector<Bit> in = get_bitstring(H.getNCols());
    std::vector<Bit> out(H.get_n_rows_mother_matrix());

    std::cout << hash_vector(in) << std::endl;
    H.encode_no_ra(in, out);

    EXPECT_EQ(hash_vector(out), 2814594723);
}